

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

Am_Connection * Am_Connection::Open(void)

{
  int iVar1;
  Am_Connection *this;
  Am_Connection_Data *pAVar2;
  int flag;
  sockaddr_in in_sa;
  
  this = (Am_Connection *)operator_new(8);
  Am_Connection(this);
  pAVar2 = (Am_Connection_Data *)operator_new(0x48);
  Am_Connection_Data::Am_Connection_Data(pAVar2);
  this->data = pAVar2;
  Add_Connection(this);
  pAVar2 = this->data;
  if (pAVar2 == (Am_Connection_Data *)0x0) {
    DAT_00000011 = 0;
  }
  else {
    pAVar2->waiting = true;
  }
  if (m_parent_socket == 0) {
    in_sa.sin_family = 2;
    in_sa.sin_port = 0x16a8;
    in_sa.sin_addr.s_addr = 0;
    m_parent_socket = socket(2,1,0);
    if (m_parent_socket < 0) {
      perror("socket");
      this->data = (Am_Connection_Data *)0x0;
    }
    else {
      flag = 1;
      max_socket = m_parent_socket;
      iVar1 = setsockopt(m_parent_socket,1,2,&flag,4);
      if (iVar1 != 0) {
        perror("setsockopt (SO_REUSE_ADDR)");
        this->data = (Am_Connection_Data *)0x0;
      }
      iVar1 = bind(m_parent_socket,(sockaddr *)&in_sa,0x10);
      if (iVar1 < 0) {
        perror("fallback bind");
      }
      iVar1 = listen(m_parent_socket,1);
      if (iVar1 < 0) {
        std::operator<<((ostream *)&std::cerr,"Listen failed\n");
      }
    }
  }
  else {
    close(*(int *)&(pAVar2->super_Am_Wrapper).field_0xc);
  }
  return this;
}

Assistant:

Am_Connection *
Am_Connection::Open(void)
{
  /*
   * Variable initialization
   */
  struct sockaddr_in in_sa; /* Internet socket addr. structure */
  Am_Connection *p_connection;
  p_connection = new Am_Connection;
  p_connection->data = new Am_Connection_Data;

  Add_Connection(p_connection);

  p_connection->Set_Waiting_Flag(true);
  if (m_parent_socket == 0) {
    /* Put host's address and address type into socket structure */
    in_sa.sin_addr.s_addr = INADDR_ANY;
    in_sa.sin_family = PF_INET;
    /* Put the port into the socket structure */
    in_sa.sin_port = Am_SOCKET_PORT;

    if ((m_parent_socket = socket(PF_INET, SOCK_STREAM, 0)) < 0) {
      perror("socket");
      p_connection->Set_Valid_Flag(false);
      // InvalidateAll();
    } else // m_parent_socket valid
    {
      max_socket = m_parent_socket;
      int flag = 1;
      if (setsockopt(m_parent_socket, SOL_SOCKET, SO_REUSEADDR, &flag,
                     sizeof(int))) {
        perror("setsockopt (SO_REUSE_ADDR)");
        p_connection->Set_Valid_Flag(false);
      }
      int count = 0;
      // bind my socket to the specified port
      int error_code = 0;
      if ((error_code = bind(m_parent_socket, (struct sockaddr *)&in_sa,
                             sizeof(in_sa))) < 0) {
        perror("fallback bind");
        count++;
        //p_connection->Set_Valid_Flag(false);
        // Invalidate_All();
      } // need to add check for failure 7/2/97
      //Set the maximum number of connections we
      //will fall behind

      if ((listen(m_parent_socket, BACKLOG)) < 0) {
        std::cerr << "Listen failed\n";
        //p_connection->Set_Valid_Flag(false);
        //Invalidate_All();
      }
    }  //m_parent_socket valid
  }    // If parent socket == 0
  else // Parent Socket initialized
    close(p_connection->Get_Socket());
  return p_connection;
}